

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O2

int NbIdenticalCar(char *track,char *searched_string,int size_max)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  
  sVar5 = strlen(searched_string);
  uVar7 = 0;
  uVar8 = 0;
  if (0 < (int)sVar5) {
    uVar8 = sVar5 & 0xffffffff;
  }
  iVar4 = 0;
  for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    bVar9 = true;
    uVar10 = 0;
    while (((((long)uVar10 < (long)size_max && (uVar10 < 8)) &&
            ((long)uVar10 < (long)((long)(int)sVar5 - uVar7))) && (bVar9))) {
      cVar2 = track[uVar10];
      iVar11 = (int)cVar2;
      cVar3 = searched_string[uVar10];
      iVar6 = (int)cVar3;
      bVar12 = iVar11 + 0x20 == iVar6;
      bVar13 = iVar6 + 0x20 == iVar11;
      uVar1 = uVar10 + 1;
      iVar6 = iVar4;
      if ((long)iVar4 <= (long)uVar10) {
        iVar6 = (int)uVar1;
      }
      bVar9 = (cVar2 == cVar3 || bVar12) || bVar13;
      uVar10 = uVar1;
      if ((cVar2 == cVar3 || bVar12) || bVar13) {
        iVar4 = iVar6;
      }
    }
    searched_string = searched_string + 1;
  }
  return iVar4;
}

Assistant:

int NbIdenticalCar(const char* track, const char* searched_string, int size_max)
{
   int i = 0;
   int lg_max = strlen(searched_string);
   int nb_car_found = 0;

   for (int j = 0; j < lg_max; j++)
   {
      bool correct = true;
      for (i = 0; i < size_max && i < 8 && i < lg_max - j && correct; i++)
      {
         if (track[i] != searched_string[j + i]
            && track[i] + 0x20 != searched_string[j + i]
            && track[i] != searched_string[j + i] + 0x20)
         {
            correct = false;
         }
         else
         {
            if (i >= nb_car_found) nb_car_found = i + 1;
         }
      }
   }

   return nb_car_found;
}